

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpotController.cpp
# Opt level: O0

void anon_unknown.dwarf_433838::local_aggregate
               (char *query,Caliper *c,ChannelBody *chB,CaliperMetadataDB *db,Aggregator *output_agg
               )

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__return_storage_ptr__;
  SnapshotProcessFn local_278;
  anon_class_32_4_81ca912e local_258;
  SnapshotFlushFn local_238;
  SnapshotView local_218;
  undefined1 local_208 [8];
  Aggregator agg;
  Preprocessor prp;
  undefined1 local_1d8 [8];
  RecordSelector filter;
  QuerySpec spec;
  Aggregator *output_agg_local;
  CaliperMetadataDB *db_local;
  ChannelBody *chB_local;
  Caliper *c_local;
  char *query_local;
  
  __return_storage_ptr__ =
       &filter.mP.
        super___shared_ptr<cali::RecordSelector::RecordSelectorImpl,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount;
  parse_spec((QuerySpec *)__return_storage_ptr__,query);
  cali::RecordSelector::RecordSelector
            ((RecordSelector *)local_1d8,(QuerySpec *)__return_storage_ptr__);
  cali::Preprocessor::Preprocessor
            ((Preprocessor *)
             &agg.mP.
              super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             (QuerySpec *)
             &filter.mP.
              super___shared_ptr<cali::RecordSelector::RecordSelectorImpl,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  cali::Aggregator::Aggregator
            ((Aggregator *)local_208,
             (QuerySpec *)
             &filter.mP.
              super___shared_ptr<cali::RecordSelector::RecordSelectorImpl,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  cali::SnapshotView::SnapshotView(&local_218);
  local_258.filter = (RecordSelector *)local_1d8;
  local_258.prp =
       (Preprocessor *)
       &agg.mP.super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount;
  local_258.agg = (Aggregator *)local_208;
  local_258.db = db;
  std::
  function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
  ::
  function<(anonymous_namespace)::local_aggregate(char_const*,cali::Caliper&,cali::ChannelBody*,cali::CaliperMetadataDB&,cali::Aggregator&)::__0,void>
            ((function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
              *)&local_238,&local_258);
  cali::Caliper::flush(c,chB,local_218,&local_238);
  std::
  function<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&)>
  ::~function(&local_238);
  std::
  function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
  ::function<cali::Aggregator&,void>
            ((function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
              *)&local_278,output_agg);
  cali::Aggregator::flush
            ((Aggregator *)local_208,&db->super_CaliperMetadataAccessInterface,&local_278);
  std::
  function<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&)>
  ::~function(&local_278);
  cali::Aggregator::~Aggregator((Aggregator *)local_208);
  cali::Preprocessor::~Preprocessor
            ((Preprocessor *)
             &agg.mP.
              super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  cali::RecordSelector::~RecordSelector((RecordSelector *)local_1d8);
  cali::QuerySpec::~QuerySpec
            ((QuerySpec *)
             &filter.mP.
              super___shared_ptr<cali::RecordSelector::RecordSelectorImpl,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void local_aggregate(const char* query, Caliper& c, ChannelBody* chB, CaliperMetadataDB& db, Aggregator& output_agg)
{
    QuerySpec spec(parse_spec(query));

    RecordSelector filter(spec);
    Preprocessor   prp(spec);
    Aggregator     agg(spec);

    c.flush(
        chB,
        SnapshotView(),
        [&db, &filter, &prp, &agg](CaliperMetadataAccessInterface& in_db, const std::vector<Entry>& rec) {
            EntryList mrec = prp.process(db, db.merge_snapshot(in_db, rec));

            if (filter.pass(db, mrec))
                agg.add(db, mrec);
        }
    );

    // write intermediate results into output aggregator
    agg.flush(db, output_agg);
}